

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ctrl_t *pcVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  slot_type *extraout_RDX;
  slot_type *extraout_RDX_00;
  slot_type *psVar6;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>
  *alloc;
  ctrl_t cVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t v;
  undefined8 new_slot;
  undefined8 uVar10;
  FindInfo FVar11;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                 );
  }
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = 0;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  CommonFields::set_capacity(common,new_capacity);
  bVar2 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,80ul,false,false,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,0x20,0x50);
  uVar10 = local_58.heap.control;
  if (local_48 != 0) {
    alloc = *(allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>
              **)((long)&common->heap_or_soo_ + 8);
    if (bVar2) {
      if (7 < local_48) {
        __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x856,
                      "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                     );
      }
      if ((0x10 < common->capacity_) || (common->capacity_ <= local_48)) {
        __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x858,
                      "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                     );
      }
      if ((char)local_3f == '\x01') {
LAB_00efc772:
        __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7ea,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      uVar9 = 0;
      uVar5 = local_48;
      psVar6 = extraout_RDX;
      new_slot = local_58.heap.slot_array;
      do {
        alloc = alloc + 0x50;
        if (kSentinel < *(ctrl_t *)(uVar10 + uVar9)) {
          common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
          ::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                    (alloc,(slot_type *)new_slot,psVar6);
          uVar5 = local_48;
          psVar6 = extraout_RDX_00;
        }
        uVar9 = uVar9 + 1;
        new_slot = new_slot + 0x50;
      } while (uVar9 < uVar5);
    }
    else {
      if ((char)local_3f == '\x01') goto LAB_00efc772;
      uVar9 = 0;
      uVar5 = local_48;
      uVar10 = local_58.heap.slot_array;
      do {
        if ((char)local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7e6,
                        "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
        }
        if (kSentinel < local_58.heap.control[uVar9]) {
          uVar5 = *(size_type *)(uVar10 + 8);
          uVar3 = hash_internal::MixingHashState::CombineContiguousImpl
                            (&hash_internal::MixingHashState::kSeed,*(undefined8 *)uVar10,uVar5);
          uVar8 = (uVar3 ^ uVar5) * -0x234dd359734ecb13;
          FVar11 = find_first_non_full<void>
                             (common,uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8
                                     | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
          uVar4 = FVar11.offset;
          uVar5 = common->capacity_;
          if (uVar5 <= uVar4) {
            __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x744,
                          "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                         );
          }
          cVar7 = (ctrl_t)(uVar8 >> 0x38) & ~kEmpty;
          pcVar1 = (common->heap_or_soo_).heap.control;
          pcVar1[uVar4] = cVar7;
          psVar6 = (slot_type *)(pcVar1 + (uVar4 - 0xf & uVar5));
          *(ctrl_t *)((ulong)((uint)uVar5 & 0xf) + (long)psVar6) = cVar7;
          common->capacity_ = 0xffffffffffffff9c;
          common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
          ::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                    (alloc + uVar4 * 0x50,(slot_type *)uVar10,psVar6);
          CommonFields::set_capacity(common,uVar5);
          uVar5 = local_48;
        }
        uVar9 = uVar9 + 1;
        uVar10 = uVar10 + 0x50;
      } while (uVar9 != uVar5);
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
    }
    HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
              ((HashSetResizeHelper *)&local_58,&local_5a,0x50);
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }